

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

void addTests_Image_Function(PerformanceTestFramework *framework)

{
  PerformanceTestFramework *in_stack_00000018;
  FunctionRegistrator *in_stack_00000020;
  
  anon_unknown.dwarf_ea1bc::FunctionRegistrator::instance();
  anon_unknown.dwarf_ea1bc::FunctionRegistrator::set(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void addTests_Image_Function( PerformanceTestFramework & framework )
{
    FunctionRegistrator::instance().set( framework );
}